

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonWriter.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::SkeletonWriter::DoPutSync
          (SkeletonWriter *this,Variable<unsigned_char> *variable,uint8_t *data)

{
  pointer pBVar1;
  pointer pBVar2;
  size_t stepsStart;
  BPInfo *blockInfo;
  pointer this_00;
  
  stepsStart = CurrentStep(this);
  blockInfo = Variable<unsigned_char>::SetBlockInfo(variable,data,stepsStart,1);
  PutSyncCommon<unsigned_char>(this,variable,blockInfo);
  pBVar1 = (variable->m_BlocksInfo).
           super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (variable->m_BlocksInfo).
           super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pBVar1;
  if (pBVar2 != pBVar1) {
    do {
      Variable<unsigned_char>::BPInfo::~BPInfo(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pBVar2);
    (variable->m_BlocksInfo).
    super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar1;
  }
  return;
}

Assistant:

void SkeletonWriter::Init()
{
    InitParameters();
    InitTransports();
}